

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneticAlgorithm.cpp
# Opt level: O2

GeneticAlgorithm * __thiscall GeneticAlgorithm::setPopulationSize(GeneticAlgorithm *this,int x)

{
  string *this_00;
  allocator local_11;
  
  if (1 < x) {
    this->destinatedPopulationSize = x;
    return this;
  }
  this_00 = (string *)__cxa_allocate_exception(0x20);
  std::__cxx11::string::string(this_00,"Population size too small",&local_11);
  __cxa_throw(this_00,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

GeneticAlgorithm& GeneticAlgorithm::setPopulationSize(int x){ 
	if(x<2) throw std::string("Population size too small");
		destinatedPopulationSize = x;
	return *this;
}